

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void __thiscall
QPDF::generateHintStream
          (QPDF *this,NewObjTable *new_obj,ObjTable *obj,string *hint_buffer,int *S,int *O,
          bool compressed)

{
  int iVar1;
  pointer pCVar2;
  pointer pMVar3;
  qpdf_offset_t local_c8;
  qpdf_offset_t local_c0;
  undefined1 local_b8 [8];
  BitWriter w;
  action_e local_94;
  byte local_8d;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_80;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_78;
  undefined1 local_6c [12];
  __single_object c;
  string b;
  bool compressed_local;
  int *O_local;
  int *S_local;
  string *hint_buffer_local;
  ObjTable *obj_local;
  NewObjTable *new_obj_local;
  QPDF *this_local;
  
  calculateHPageOffset(this,new_obj,obj);
  calculateHSharedObject(this,new_obj,obj);
  calculateHOutline(this,new_obj,obj);
  std::__cxx11::string::string((string *)&c);
  local_8d = 0;
  if (compressed) {
    local_6c._0_4_ = 0;
    ::qpdf::pl::create<qpdf::pl::String,std::__cxx11::string&>((pl *)&local_80,hint_buffer);
    local_8d = 1;
    local_94 = a_deflate;
    ::qpdf::pl::create<Pl_Flate,Pl_Flate::action_e>
              ((pl *)&local_78,&local_80,&stack0xffffffffffffff6c);
    std::
    make_unique<qpdf::pl::Count,int,std::__cxx11::string&,std::unique_ptr<qpdf::pl::Link,std::default_delete<qpdf::pl::Link>>>
              ((int *)(local_6c + 4),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c,
               (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&c);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_78);
  }
  else {
    w.bit_offset._4_4_ = 0;
    std::make_unique<qpdf::pl::Count,int,std::__cxx11::string&>
              ((int *)(local_6c + 4),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&w.bit_offset + 4));
  }
  if ((local_8d & 1) != 0) {
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_80);
  }
  pCVar2 = std::unique_ptr<qpdf::pl::Count,_std::default_delete<qpdf::pl::Count>_>::get
                     ((unique_ptr<qpdf::pl::Count,_std::default_delete<qpdf::pl::Count>_> *)
                      (local_6c + 4));
  BitWriter::BitWriter((BitWriter *)local_b8,&pCVar2->super_Pipeline);
  writeHPageOffset(this,(BitWriter *)local_b8);
  pCVar2 = std::unique_ptr<qpdf::pl::Count,_std::default_delete<qpdf::pl::Count>_>::operator->
                     ((unique_ptr<qpdf::pl::Count,_std::default_delete<qpdf::pl::Count>_> *)
                      (local_6c + 4));
  local_c0 = ::qpdf::pl::Count::getCount(pCVar2);
  iVar1 = toI<long_long>(&local_c0);
  *S = iVar1;
  writeHSharedObject(this,(BitWriter *)local_b8);
  *O = 0;
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  if (0 < (pMVar3->outline_hints).nobjects) {
    pCVar2 = std::unique_ptr<qpdf::pl::Count,_std::default_delete<qpdf::pl::Count>_>::operator->
                       ((unique_ptr<qpdf::pl::Count,_std::default_delete<qpdf::pl::Count>_> *)
                        (local_6c + 4));
    local_c8 = ::qpdf::pl::Count::getCount(pCVar2);
    iVar1 = toI<long_long>(&local_c8);
    *O = iVar1;
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    writeHGeneric(this,(BitWriter *)local_b8,&pMVar3->outline_hints);
  }
  pCVar2 = std::unique_ptr<qpdf::pl::Count,_std::default_delete<qpdf::pl::Count>_>::operator->
                     ((unique_ptr<qpdf::pl::Count,_std::default_delete<qpdf::pl::Count>_> *)
                      (local_6c + 4));
  ::qpdf::pl::Count::finish(pCVar2);
  std::unique_ptr<qpdf::pl::Count,_std::default_delete<qpdf::pl::Count>_>::~unique_ptr
            ((unique_ptr<qpdf::pl::Count,_std::default_delete<qpdf::pl::Count>_> *)(local_6c + 4));
  std::__cxx11::string::~string((string *)&c);
  return;
}

Assistant:

void
QPDF::generateHintStream(
    QPDFWriter::NewObjTable const& new_obj,
    QPDFWriter::ObjTable const& obj,
    std::string& hint_buffer,
    int& S,
    int& O,
    bool compressed)
{
    // Populate actual hint table values
    calculateHPageOffset(new_obj, obj);
    calculateHSharedObject(new_obj, obj);
    calculateHOutline(new_obj, obj);

    // Write the hint stream itself into a compressed memory buffer. Write through a counter so we
    // can get offsets.
    std::string b;
    auto c = compressed
        ? std::make_unique<pl::Count>(
              0, b, pl::create<Pl_Flate>(pl::create<pl::String>(hint_buffer), Pl_Flate::a_deflate))
        : std::make_unique<pl::Count>(0, hint_buffer);

    BitWriter w(c.get());

    writeHPageOffset(w);
    S = toI(c->getCount());
    writeHSharedObject(w);
    O = 0;
    if (m->outline_hints.nobjects > 0) {
        O = toI(c->getCount());
        writeHGeneric(w, m->outline_hints);
    }
    c->finish();
}